

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unnamed_pipe.c
# Opt level: O2

int main(void)

{
  __pid_t _Var1;
  int in_RAX [2];
  FILE *ui;
  char *uis;
  int fds [2];
  
  fds = in_RAX;
  pipe(fds);
  _Var1 = fork();
  if (_Var1 == 0) {
    close(fds[1]);
    uis = "r";
    ui = fdopen(fds[0],"r");
    reader((UI *)ui,(UI_STRING *)uis);
    fds[1] = fds[0];
  }
  else {
    close(fds[0]);
    fdopen(fds[1],"w");
    writer((UI *)"Hello, world.",(UI_STRING *)0x3);
  }
  close(fds[1]);
  return 0;
}

Assistant:

int main () 
{
    FILE * stream;
    /* Create pipe place the two ends pipe file descriptors in fds */
    int fds[2];
    pipe(fds);
    pid_t pid = fork();
    if(pid == (pid_t) 0) 
    {/* Child process (consumer) */
        close(fds[1]);         
        /* Close the copy of the fds write end */
        stream = fdopen(fds[0], "r");
        reader(stream);
        close(fds[0]);
        
    }
    else 
    {                   
        /* Parent process (producer)  */
        close(fds[0]);         
        /* Close the copy of the fds read end */
        stream = fdopen(fds[1], "w");
        writer("Hello, world.", 3, stream);
        close(fds[1]);
    }
    return 0;
    
}